

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O0

void list_store_set(t_list_store *x,t_symbol *s,int argc,t_atom *argv)

{
  uint where;
  int iVar1;
  t_float tVar2;
  int local_38;
  int onset;
  int max;
  int n;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_list_store *x_local;
  
  if (1 < argc) {
    tVar2 = atom_getfloat(argv);
    where = (uint)tVar2;
    if (((int)where < 0) || ((x->x_alist).l_n <= (int)where)) {
      pd_error(x,"list_store_set: index %d out of range",(ulong)where);
    }
    else {
      local_38 = argc + -1;
      iVar1 = (x->x_alist).l_n - where;
      if (iVar1 < local_38) {
        local_38 = iVar1;
      }
      alist_copyin(&x->x_alist,s,local_38,argv + 1,where);
    }
  }
  return;
}

Assistant:

static void list_store_set(t_list_store *x, t_symbol *s, int argc, t_atom *argv)
{
    if (argc > 1)
    {
        int n, max, onset = atom_getfloat(argv);
        if (onset < 0 || onset >= x->x_alist.l_n)
        {
            pd_error(x, "list_store_set: index %d out of range", onset);
            return;
        }
        argc--; argv++;
        max = x->x_alist.l_n - onset;
        n = (argc > max) ? max : argc;
        alist_copyin(&x->x_alist, s, n, argv, onset);
    }
}